

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_doing(connectdata *conn,_Bool *dophase_done)

{
  CURLcode CVar1;
  
  CVar1 = imap_multi_statemach(conn,dophase_done);
  if (((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, *dophase_done == true)) &&
     (*(conn->data->req).protop != 0)) {
    CVar1 = CURLE_OK;
    Curl_setup_transfer(conn->data,-1,-1,false,-1);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result = imap_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = imap_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }

  return result;
}